

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

commonNaNT * floatx80ToCommonNaN(commonNaNT *__return_storage_ptr__,floatx80 a,float_status *status)

{
  int iVar1;
  floatx80 fVar2;
  floatx80 dflt;
  float_status *status_local;
  floatx80 a_local;
  
  fVar2._10_6_ = 0;
  fVar2.low = (long)a._0_10_;
  fVar2.high = (short)(a._0_10_ >> 0x40);
  iVar1 = floatx80_is_signaling_nan_tricore(fVar2,status);
  if (iVar1 != 0) {
    float_raise_tricore('\x01',status);
  }
  if ((long)a.low < 0) {
    __return_storage_ptr__->sign = (flag)((int)(uint)a.high >> 0xf);
    __return_storage_ptr__->low = 0;
    __return_storage_ptr__->high = a.low << 1;
  }
  else {
    fVar2 = floatx80_default_nan_tricore(status);
    __return_storage_ptr__->sign = (flag)((int)(uint)fVar2.high >> 0xf);
    __return_storage_ptr__->low = 0;
    __return_storage_ptr__->high = fVar2.low << 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static commonNaNT floatx80ToCommonNaN(floatx80 a, float_status *status)
{
    floatx80 dflt;
    commonNaNT z;

    if (floatx80_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    if (a.low >> 63) {
        z.sign = a.high >> 15;
        z.low = 0;
        z.high = a.low << 1;
    } else {
        dflt = floatx80_default_nan(status);
        z.sign = dflt.high >> 15;
        z.low = 0;
        z.high = dflt.low << 1;
    }
    return z;
}